

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCopier::InstallFile
          (cmFileCopier *this,char *fromFile,char *toFile,MatchProperties *match_properties)

{
  cmCommand *pcVar1;
  MatchProperties *pMVar2;
  char *pcVar3;
  bool bVar4;
  ostream *poVar5;
  mode_t local_474;
  byte local_3e1;
  mode_t local_3d4;
  undefined1 local_3d0 [4];
  mode_t permissions;
  ostringstream local_3b0 [8];
  ostringstream e_1;
  mode_t local_234;
  undefined1 local_230 [4];
  mode_t perm;
  ostringstream local_210 [8];
  ostringstream e;
  allocator local_91;
  string local_90;
  byte local_6d;
  byte local_5a;
  allocator local_59;
  string local_58;
  byte local_31;
  MatchProperties *pMStack_30;
  bool copy;
  MatchProperties *match_properties_local;
  char *toFile_local;
  char *fromFile_local;
  cmFileCopier *this_local;
  
  local_31 = 1;
  pMStack_30 = match_properties;
  match_properties_local = (MatchProperties *)toFile;
  toFile_local = fromFile;
  fromFile_local = (char *)this;
  if (((this->Always & 1U) == 0) &&
     (bVar4 = cmFileTimeComparison::FileTimesDiffer(&this->FileTimes,fromFile,toFile), !bVar4)) {
    local_31 = 0;
  }
  (*this->_vptr_cmFileCopier[4])(this,match_properties_local,0,(ulong)(local_31 & 1));
  pcVar3 = toFile_local;
  local_5a = 0;
  local_6d = 0;
  local_3e1 = 0;
  if ((local_31 & 1) != 0) {
    std::allocator<char>::allocator();
    local_5a = 1;
    std::__cxx11::string::string((string *)&local_58,pcVar3,&local_59);
    pMVar2 = match_properties_local;
    local_6d = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,&pMVar2->Exclude,&local_91);
    bVar4 = cmsys::SystemTools::CopyAFile(&local_58,&local_90,true);
    local_3e1 = bVar4 ^ 0xff;
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  if ((local_6d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((local_5a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  if ((local_3e1 & 1) == 0) {
    if (((local_31 & 1) != 0) && ((this->Always & 1U) == 0)) {
      local_234 = 0;
      bVar4 = cmsys::SystemTools::GetPermissions(&match_properties_local->Exclude,&local_234);
      if (bVar4) {
        cmsys::SystemTools::SetPermissions
                  (&match_properties_local->Exclude,local_234 | mode_owner_write,false);
      }
      bVar4 = cmSystemTools::CopyFileTime(toFile_local,&match_properties_local->Exclude);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream(local_3b0);
        poVar5 = std::operator<<((ostream *)local_3b0,this->Name);
        poVar5 = std::operator<<(poVar5," cannot set modification time on \"");
        poVar5 = std::operator<<(poVar5,&match_properties_local->Exclude);
        std::operator<<(poVar5,"\"");
        pcVar1 = &this->FileCommand->super_cmCommand;
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(pcVar1,(string *)local_3d0);
        std::__cxx11::string::~string((string *)local_3d0);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_3b0);
        goto LAB_00719919;
      }
    }
    if (pMStack_30->Permissions == 0) {
      local_474 = this->FilePermissions;
    }
    else {
      local_474 = pMStack_30->Permissions;
    }
    local_3d4 = local_474;
    if (local_474 == 0) {
      cmsys::SystemTools::GetPermissions(toFile_local,&local_3d4);
    }
    this_local._7_1_ = SetPermissions(this,&match_properties_local->Exclude,local_3d4);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_210);
    poVar5 = std::operator<<((ostream *)local_210,this->Name);
    poVar5 = std::operator<<(poVar5," cannot copy file \"");
    poVar5 = std::operator<<(poVar5,toFile_local);
    poVar5 = std::operator<<(poVar5,"\" to \"");
    poVar5 = std::operator<<(poVar5,&match_properties_local->Exclude);
    std::operator<<(poVar5,"\".");
    pcVar1 = &this->FileCommand->super_cmCommand;
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(pcVar1,(string *)local_230);
    std::__cxx11::string::~string((string *)local_230);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_210);
  }
LAB_00719919:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCopier::InstallFile(const char* fromFile, const char* toFile,
                               MatchProperties const& match_properties)
{
  // Determine whether we will copy the file.
  bool copy = true;
  if(!this->Always)
    {
    // If both files exist with the same time do not copy.
    if(!this->FileTimes.FileTimesDiffer(fromFile, toFile))
      {
      copy = false;
      }
    }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeFile, copy);

  // Copy the file.
  if(copy && !cmSystemTools::CopyAFile(fromFile, toFile, true))
    {
    std::ostringstream e;
    e << this->Name << " cannot copy file \"" << fromFile
      << "\" to \"" << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Set the file modification time of the destination file.
  if(copy && !this->Always)
    {
    // Add write permission so we can set the file time.
    // Permissions are set unconditionally below anyway.
    mode_t perm = 0;
    if(cmSystemTools::GetPermissions(toFile, perm))
      {
      cmSystemTools::SetPermissions(toFile, perm | mode_owner_write);
      }
    if (!cmSystemTools::CopyFileTime(fromFile, toFile))
      {
      std::ostringstream e;
      e << this->Name << " cannot set modification time on \""
        << toFile << "\"";
      this->FileCommand->SetError(e.str());
      return false;
      }
    }

  // Set permissions of the destination file.
  mode_t permissions = (match_properties.Permissions?
                        match_properties.Permissions : this->FilePermissions);
  if(!permissions)
    {
    // No permissions were explicitly provided but the user requested
    // that the source file permissions be used.
    cmSystemTools::GetPermissions(fromFile, permissions);
    }
  return this->SetPermissions(toFile, permissions);
}